

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::update<QRect>(QWidgetPrivate *this,QRect r)

{
  undefined1 *puVar1;
  QWidgetData **ppQVar2;
  QWidget *widget;
  QWidgetData *pQVar3;
  QWidget *pQVar4;
  long lVar5;
  QRect QVar6;
  QEvent *this_00;
  QWidget *pQVar7;
  long in_FS_OFFSET;
  QRect local_50;
  QRect local_40;
  QRect local_30;
  long local_20;
  
  QVar6._8_8_ = local_40._8_8_;
  QVar6._0_8_ = local_40._0_8_;
  local_30._8_8_ = r._8_8_;
  local_30._0_8_ = r._0_8_;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  widget = *(QWidget **)&this->field_0x8;
  pQVar3 = widget->data;
  if (((*(uint *)&this->field_0x250 >> 0x18 & 1) == 0) ||
     ((pQVar3->widget_attributes & 0x8000) != 0)) {
    if ((pQVar3->widget_attributes & 0x8400) == 0x8000) {
      local_50.x2.m_i = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
      local_50.y2.m_i = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
      local_50.x1.m_i = 0;
      local_50.y1.m_i = 0;
      local_40 = (QRect)QRect::operator&(&local_30,&local_50);
      if ((local_40.x1.m_i.m_i <= local_40.x2.m_i.m_i) &&
         (local_40.y1.m_i.m_i <= local_40.y2.m_i.m_i)) {
        pQVar7 = widget;
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x243) & 0x40) == 0) {
          do {
            puVar1 = &pQVar7->field_0x8;
            pQVar4 = *(QWidget **)(*(long *)puVar1 + 0x10);
            if (pQVar4 == (QWidget *)0x0) break;
            ppQVar2 = &pQVar7->data;
            pQVar7 = pQVar4;
          } while ((((*ppQVar2)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
          lVar5 = *(long *)(*(long *)puVar1 + 0x78);
          if ((((lVar5 != 0) && (lVar5 = *(long *)(lVar5 + 8), lVar5 != 0)) &&
              (*(long *)(lVar5 + 0x10) != 0)) &&
             (*(QWidgetRepaintManager **)(lVar5 + 8) != (QWidgetRepaintManager *)0x0)) {
            QWidgetRepaintManager::markDirty<QRect>
                      (*(QWidgetRepaintManager **)(lVar5 + 8),&local_40,widget,UpdateLater,
                       BufferValid);
          }
        }
        else {
          this_00 = (QEvent *)operator_new(0x18);
          QRegion::QRegion((QRegion *)&local_50,&local_40,Rectangle);
          QEvent::QEvent(this_00,UpdateLater);
          *(undefined ***)this_00 = &PTR__QUpdateLaterEvent_007e7dd8;
          QRegion::QRegion((QRegion *)(this_00 + 0x10),(QRegion *)&local_50);
          QCoreApplication::postEvent(&widget->super_QObject,this_00,0);
          QRegion::~QRegion((QRegion *)&local_50);
        }
      }
    }
  }
  else {
    *(uint *)&this->field_0x250 = *(uint *)&this->field_0x250 | 0x8000000;
    local_40 = QVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::update(T r)
{
    Q_Q(QWidget);

    if (renderToTexture && !q->isVisible()) {
        renderToTextureReallyDirty = 1;
        return;
    }

    if (!q->isVisible() || !q->updatesEnabled())
        return;

    T clipped = r & q->rect();

    if (clipped.isEmpty())
        return;

    if (q->testAttribute(Qt::WA_WState_InPaintEvent)) {
        QCoreApplication::postEvent(q, new QUpdateLaterEvent(clipped));
        return;
    }

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore && tlwExtra->repaintManager)
        tlwExtra->repaintManager->markDirty(clipped, q);
}